

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLinkPointTriface::ChLinkPointTriface
          (ChLinkPointTriface *this,ChLinkPointTriface *other)

{
  double dVar1;
  undefined1 auVar2 [32];
  
  ChLinkBase::ChLinkBase(&this->super_ChLinkBase,&other->super_ChLinkBase);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkPointTriface_00b28da8;
  (this->react).m_data[0] = 0.0;
  (this->react).m_data[1] = 0.0;
  (this->react).m_data[2] = 0.0;
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->constraint1).super_ChConstraint.c_i = (double)auVar2._0_8_;
  (this->constraint1).super_ChConstraint.l_i = (double)auVar2._8_8_;
  (this->constraint1).super_ChConstraint.b_i = (double)auVar2._16_8_;
  (this->constraint1).super_ChConstraint.cfm_i = (double)auVar2._24_8_;
  (this->constraint1).super_ChConstraint.valid = false;
  (this->constraint1).super_ChConstraint.disabled = false;
  (this->constraint1).super_ChConstraint.redundant = false;
  (this->constraint1).super_ChConstraint.broken = false;
  (this->constraint1).super_ChConstraint.active = true;
  (this->constraint1).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint1).super_ChConstraint.g_i = 0.0;
  (this->constraint1).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoTuples_00b29380;
  (this->constraint1).tuple_b.variables_2 = (ChVariables *)0x0;
  (this->constraint1).tuple_b.variables_3 = (ChVariables *)0x0;
  (this->constraint1).tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint1).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint1).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint1).tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint1).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint1).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint1).tuple_a.variables = (ChVariables *)0x0;
  (this->constraint1).tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint1).tuple_a.Cq.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint1).tuple_a.Cq.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint1).tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint1).tuple_a.Eq.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint1).tuple_a.Eq.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint1).tuple_b.variables_1 = (ChVariables *)0x0;
  *(double *)
   ((long)(this->constraint1).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint1).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint1).tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint1).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint1).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint1).tuple_b.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint1).tuple_b.Cq_3.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint1).tuple_b.Cq_3.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint2).super_ChConstraint.c_i = (double)auVar2._0_8_;
  (this->constraint2).super_ChConstraint.l_i = (double)auVar2._8_8_;
  (this->constraint2).super_ChConstraint.b_i = (double)auVar2._16_8_;
  (this->constraint2).super_ChConstraint.cfm_i = (double)auVar2._24_8_;
  (this->constraint2).super_ChConstraint.valid = false;
  (this->constraint2).super_ChConstraint.disabled = false;
  (this->constraint2).super_ChConstraint.redundant = false;
  (this->constraint2).super_ChConstraint.broken = false;
  (this->constraint2).super_ChConstraint.active = true;
  (this->constraint2).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint2).super_ChConstraint.g_i = 0.0;
  (this->constraint2).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoTuples_00b29380;
  *(double *)
   ((long)(this->constraint2).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint2).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint2).tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint2).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint2).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint2).tuple_b.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint2).tuple_b.Cq_3.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint2).tuple_b.Cq_3.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint2).tuple_b.variables_2 = (ChVariables *)0x0;
  (this->constraint2).tuple_b.variables_3 = (ChVariables *)0x0;
  (this->constraint2).tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint2).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint2).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint2).tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint2).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint2).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint2).tuple_a.variables = (ChVariables *)0x0;
  (this->constraint2).tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint2).tuple_a.Cq.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint2).tuple_a.Cq.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint2).tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint2).tuple_a.Eq.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint2).tuple_a.Eq.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint2).tuple_b.variables_1 = (ChVariables *)0x0;
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->constraint3).super_ChConstraint.c_i = (double)auVar2._0_8_;
  (this->constraint3).super_ChConstraint.l_i = (double)auVar2._8_8_;
  (this->constraint3).super_ChConstraint.b_i = (double)auVar2._16_8_;
  (this->constraint3).super_ChConstraint.cfm_i = (double)auVar2._24_8_;
  (this->constraint3).super_ChConstraint.valid = false;
  (this->constraint3).super_ChConstraint.disabled = false;
  (this->constraint3).super_ChConstraint.redundant = false;
  (this->constraint3).super_ChConstraint.broken = false;
  (this->constraint3).super_ChConstraint.active = true;
  (this->constraint3).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint3).super_ChConstraint.g_i = 0.0;
  (this->constraint3).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoTuples_00b29380;
  (this->constraint3).tuple_b.variables_2 = (ChVariables *)0x0;
  (this->constraint3).tuple_b.variables_3 = (ChVariables *)0x0;
  (this->constraint3).tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint3).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint3).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint3).tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint3).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint3).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint3).tuple_a.variables = (ChVariables *)0x0;
  (this->constraint3).tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint3).tuple_a.Cq.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint3).tuple_a.Cq.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint3).tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint3).tuple_a.Eq.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint3).tuple_a.Eq.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint3).tuple_b.variables_1 = (ChVariables *)0x0;
  *(double *)
   ((long)(this->constraint3).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint3).tuple_b.Cq_1.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint3).tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint3).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint3).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->constraint3).tuple_b.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->constraint3).tuple_b.Cq_3.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->constraint3).tuple_b.Cq_3.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mtriangle).super_ChVariableTupleCarrier_3vars<3,_3,_3>._vptr_ChVariableTupleCarrier_3vars =
       (_func_int **)&PTR__ChTriangleOfXYZnodes_00b29288;
  (this->mtriangle).mnodeB1 = (shared_ptr<chrono::fea::ChNodeFEAxyz>)auVar2._0_16_;
  (this->mtriangle).mnodeB2 = (shared_ptr<chrono::fea::ChNodeFEAxyz>)auVar2._16_16_;
  (this->mtriangle).mnodeB2 = (shared_ptr<chrono::fea::ChNodeFEAxyz>)auVar2._0_16_;
  (this->mtriangle).mnodeB3 = (shared_ptr<chrono::fea::ChNodeFEAxyz>)auVar2._16_16_;
  if (other != this) {
    (this->react).m_data[0] = (other->react).m_data[0];
    (this->react).m_data[1] = (other->react).m_data[1];
    (this->react).m_data[2] = (other->react).m_data[2];
  }
  dVar1 = other->s3;
  this->s2 = other->s2;
  this->s3 = dVar1;
  this->d = other->d;
  return;
}

Assistant:

ChLinkPointTriface::ChLinkPointTriface(const ChLinkPointTriface& other) : ChLinkBase(other) {
    react = other.react;
    s2 = other.s2;
    s3 = other.s3;
    d = other.d;
}